

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

descriptor_state * __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::alloc<bool>
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this,bool arg)

{
  descriptor_state *pdVar1;
  descriptor_state **ppdVar2;
  long *in_RDI;
  descriptor_state *o;
  descriptor_state *local_18;
  
  local_18 = (descriptor_state *)in_RDI[1];
  if (local_18 == (descriptor_state *)0x0) {
    local_18 = object_pool_access::create<asio::detail::epoll_reactor::descriptor_state,bool>
                         (SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)in_RDI[1]);
    in_RDI[1] = (long)*ppdVar2;
  }
  pdVar1 = (descriptor_state *)*in_RDI;
  ppdVar2 = object_pool_access::next<asio::detail::epoll_reactor::descriptor_state>(local_18);
  *ppdVar2 = pdVar1;
  ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>(local_18);
  *ppdVar2 = (descriptor_state *)0x0;
  if (*in_RDI != 0) {
    ppdVar2 = object_pool_access::prev<asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)*in_RDI);
    *ppdVar2 = local_18;
  }
  *in_RDI = (long)local_18;
  return local_18;
}

Assistant:

Object* alloc(Arg arg)
  {
    Object* o = free_list_;
    if (o)
      free_list_ = object_pool_access::next(free_list_);
    else
      o = object_pool_access::create<Object>(arg);

    object_pool_access::next(o) = live_list_;
    object_pool_access::prev(o) = 0;
    if (live_list_)
      object_pool_access::prev(live_list_) = o;
    live_list_ = o;

    return o;
  }